

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileGate.cpp
# Opt level: O3

State __thiscall
TileGate::_findNextStateOR
          (TileGate *this,State *adjacentStates,int numInputs,int numHigh,int numMiddle)

{
  State SVar1;
  
  if ((1 < numInputs) && ((SVar1 = HIGH, 0 < numHigh || (SVar1 = MIDDLE, 0 < numMiddle)))) {
    return SVar1;
  }
  return LOW;
}

Assistant:

State TileGate::_findNextStateOR(State adjacentStates[4], int numInputs, int numHigh, int numMiddle) const {
    if (numInputs >= 2) {
        if (numHigh >= 1) {
            return HIGH;
        } else if (numMiddle >= 1) {
            return MIDDLE;
        }
    }
    return LOW;
}